

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::reparentWidgets(QDockAreaLayoutInfo *this,QWidget *parent)

{
  bool bVar1;
  int iVar2;
  QWidget *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  QDockWidgetGroupWindow *pQVar5;
  QDockAreaLayoutInfo *pQVar6;
  QDockAreaLayoutInfo *in_RSI;
  QWidget *in_RDI;
  bool hidden;
  QWidget *w;
  QDockAreaLayoutItem *item;
  int i;
  QWidget *in_stack_00000068;
  QWidget *in_stack_00000070;
  WindowFlags in_stack_000001b0;
  qsizetype in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar8;
  QWidget *this_01;
  
  if (*(long *)&in_RDI[2].super_QPaintDevice != 0) {
    QWidget::setParent((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_RDI);
  }
  iVar8 = 0;
  while( true ) {
    this_00 = (QWidget *)(long)iVar8;
    qVar3 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)&in_RDI[1].field_0x18);
    if (qVar3 <= (long)this_00) break;
    pQVar4 = QList<QDockAreaLayoutItem>::at
                       ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if ((pQVar4->flags & 1) == 0) {
      if (pQVar4->subinfo != (QDockAreaLayoutInfo *)0x0) {
        reparentWidgets(in_RSI,(QWidget *)CONCAT44(iVar8,in_stack_ffffffffffffffe8));
      }
      if (pQVar4->widgetItem != (QLayoutItem *)0x0) {
        iVar2 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])();
        this_01 = (QWidget *)CONCAT44(extraout_var,iVar2);
        pQVar5 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x57641e);
        if ((pQVar5 == (QDockWidgetGroupWindow *)0x0) &&
           (pQVar6 = (QDockAreaLayoutInfo *)QObject::parent((QObject *)0x576430), pQVar6 != in_RSI))
        {
          bVar1 = QWidget::isHidden((QWidget *)0x576441);
          uVar7 = (uint)bVar1 << 0x18;
          QWidget::windowFlags(this_01);
          QWidget::setParent(in_stack_00000070,in_stack_00000068,in_stack_000001b0);
          in_stack_ffffffffffffffb0 = this_01;
          if ((uVar7 & 0x1000000) == 0) {
            QWidget::show(this_00);
            in_stack_ffffffffffffffb0 = this_01;
          }
        }
      }
    }
    iVar8 = iVar8 + 1;
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::reparentWidgets(QWidget *parent)
{
    if (tabBar)
        tabBar->setParent(parent);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;
        if (item.subinfo)
            item.subinfo->reparentWidgets(parent);
        if (item.widgetItem) {
            QWidget *w = item.widgetItem->widget();
            if (qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;
            if (w->parent() != parent) {
                bool hidden = w->isHidden();
                w->setParent(parent, w->windowFlags());
                if (!hidden)
                    w->show();
            }
        }
    }
}